

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_info.cpp
# Opt level: O0

string * license::os::get_cpu_brand_abi_cxx11_(void)

{
  uint uVar1;
  string *in_RDI;
  allocator local_89;
  string local_88 [48];
  uint auStack_58 [2];
  uint32_t brand [16];
  string *result;
  
  brand[0xf]._3_1_ = 0;
  std::__cxx11::string::string((string *)in_RDI);
  uVar1 = __get_cpuid_max(0x80000004,(uint *)0x0);
  if (uVar1 == 0) {
    std::__cxx11::string::operator=((string *)in_RDI,"NA");
  }
  else {
    brand[10] = 0;
    brand[0xb] = 0;
    brand[0xc] = 0;
    brand[0xd] = 0;
    brand[6] = 0;
    brand[7] = 0;
    brand[8] = 0;
    brand[9] = 0;
    brand[2] = 0;
    brand[3] = 0;
    brand[4] = 0;
    brand[5] = 0;
    auStack_58[0] = 0;
    auStack_58[1] = 0;
    brand[0] = 0;
    brand[1] = 0;
    __get_cpuid(0x80000002,auStack_58,auStack_58 + 1,brand,brand + 1);
    __get_cpuid(0x80000003,brand + 2,brand + 3,brand + 4,brand + 5);
    __get_cpuid(0x80000004,brand + 6,brand + 7,brand + 8,brand + 9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,(char *)auStack_58,&local_89);
    std::__cxx11::string::operator=((string *)in_RDI,local_88);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  return in_RDI;
}

Assistant:

static string get_cpu_brand() {
	string result;
	uint32_t brand[0x10];

	if (!__get_cpuid_max(0x80000004, NULL)) {
		result = "NA";
	} else {
		memset(brand, 0, sizeof(brand));
		__get_cpuid(0x80000002, brand + 0x0, brand + 0x1, brand + 0x2, brand + 0x3);
		__get_cpuid(0x80000003, brand + 0x4, brand + 0x5, brand + 0x6, brand + 0x7);
		__get_cpuid(0x80000004, brand + 0x8, brand + 0x9, brand + 0xa, brand + 0xb);
		result = string(reinterpret_cast<char *>(brand));
	}
	return result;
}